

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O2

void charactersDebug(void *ctx,xmlChar *ch,int len)

{
  ulong uVar1;
  char output [40];
  xmlChar local_28 [40];
  
  callbacks = callbacks + 1;
  for (uVar1 = 0; ((long)uVar1 < (long)len && (uVar1 < 0x1e)); uVar1 = uVar1 + 1) {
    local_28[uVar1] = ch[uVar1];
  }
  local_28[uVar1] = '\0';
  fprintf((FILE *)SAXdebug,"SAX.characters(%s, %d)\n",local_28,len);
  return;
}

Assistant:

static void
charactersDebug(void *ctx ATTRIBUTE_UNUSED, const xmlChar *ch, int len)
{
    char output[40];
    int i;

    callbacks++;
    if (quiet)
	return;
    for (i = 0;(i<len) && (i < 30);i++)
	output[i] = (char) ch[i];
    output[i] = 0;

    fprintf(SAXdebug, "SAX.characters(%s, %d)\n", output, len);
}